

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O0

_Bool al_install_keyboard(void)

{
  _Bool _Var1;
  char *in_RAX;
  ALLEGRO_SYSTEM *pAVar2;
  _func_void *unaff_retaddr;
  
  if (new_keyboard_driver == (ALLEGRO_KEYBOARD_DRIVER *)0x0) {
    pAVar2 = al_get_system_driver();
    if (pAVar2->vt->get_keyboard_driver == (_func_ALLEGRO_KEYBOARD_DRIVER_ptr *)0x0) {
      _Var1 = false;
    }
    else {
      pAVar2 = al_get_system_driver();
      new_keyboard_driver = (*pAVar2->vt->get_keyboard_driver)();
      _Var1 = (*new_keyboard_driver->init_keyboard)();
      if (_Var1) {
        _al_add_exit_func(unaff_retaddr,in_RAX);
        _Var1 = true;
      }
      else {
        new_keyboard_driver = (ALLEGRO_KEYBOARD_DRIVER *)0x0;
        _Var1 = false;
      }
    }
  }
  else {
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_install_keyboard(void)
{
   if (new_keyboard_driver)
      return true;

   //FIXME: seems A4/A5 driver list stuff doesn't quite agree right now
   if (al_get_system_driver()->vt->get_keyboard_driver) {
       new_keyboard_driver = al_get_system_driver()->vt->get_keyboard_driver();
       if (!new_keyboard_driver->init_keyboard()) {
          new_keyboard_driver = NULL;
          return false;
       }
       _al_add_exit_func(al_uninstall_keyboard, "al_uninstall_keyboard");
       return true;
   }

   return false;

   /*
   if (system_driver->keyboard_drivers)
      driver_list = system_driver->keyboard_drivers();
   else
      driver_list = _al_keyboard_driver_list;

   for (i=0; driver_list[i].driver; i++) {
      new_keyboard_driver = driver_list[i].driver;
      name = get_config_text(new_keyboard_driver->keydrv_ascii_name);
      new_keyboard_driver->keydrv_name = name;
      new_keyboard_driver->keydrv_desc = name;
      if (new_keyboard_driver->init_keyboard())
	 break;
   }

   if (!driver_list[i].driver) {
      new_keyboard_driver = NULL;
      return false;
   }

   //set_leds(-1);

   _al_add_exit_func(al_uninstall_keyboard, "al_uninstall_keyboard");


   return true;
   */
}